

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O1

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpBBs
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *graph,int ind)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  
  p_Var1 = &(graph->_blocks)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (graph->_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    dumpBB(this,(BBlock<dg::LLVMNode> *)p_Var2[1]._M_parent,ind);
  }
  if ((this->options & 3) != 0) {
    iVar3 = ind;
    if (0 < ind) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->out,"\t",1);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->out,"/* CFG edges */\n",0x10);
    for (p_Var2 = (graph->_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != p_Var1;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      dumpBBedges(this,(BBlock<dg::LLVMNode> *)p_Var2[1]._M_parent,ind);
    }
  }
  return;
}

Assistant:

void dumpBBs(DependenceGraph<NodeT> *graph, int ind = 1) {
        for (auto it : graph->getBlocks())
            dumpBB(it.second, ind);

        // print CFG edges between BBs
        if (options & (PRINT_CFG | PRINT_REV_CFG)) {
            out << Indent(ind) << "/* CFG edges */\n";
            for (auto it : graph->getBlocks())
                dumpBBedges(it.second, ind);
        }
    }